

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ClassEscapePass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  EncodedChar *pEVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  uint uVar6;
  undefined4 *puVar7;
  EncodedChar *pEVar8;
  uint uVar9;
  uint uVar10;
  CharCount n;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  
  pEVar8 = this->next;
  if (this->inputLim < pEVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ebdb87;
    *puVar7 = 0;
    pEVar8 = this->next;
  }
  uVar12 = (ulong)(ushort)*pEVar8;
  if (uVar12 == 0) {
    if (this->inputLim <= pEVar8) {
      Fail(this,-0x7ff5ec67);
      return false;
    }
LAB_00ebd4a4:
    if ((ASCIIChars::classes[uVar12] & 0x20) != 0) {
      iVar11 = 3;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar9 = 0;
      do {
        if (this->inputLim < pEVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ebdb87;
          *puVar7 = 0;
          pEVar8 = this->next;
          uVar12 = (ulong)(ushort)*pEVar8;
          uVar13 = 0;
          if ((ushort)*pEVar8 < 0x100) goto LAB_00ebd62f;
        }
        else {
LAB_00ebd62f:
          uVar13 = (uint)(byte)ASCIIChars::values[uVar12];
        }
        uVar13 = uVar9 * 8 + uVar13;
        if (0xff < uVar13) goto LAB_00ebd747;
        if (this->inputLim < pEVar8 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ebdb87;
          *puVar7 = 0;
          pEVar8 = this->next;
        }
        pEVar8 = pEVar8 + 1;
        this->next = pEVar8;
        iVar11 = iVar11 + -1;
        uVar9 = uVar13;
        if (iVar11 == 0) goto LAB_00ebd747;
        if (this->inputLim < pEVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ebdb87;
          *puVar7 = 0;
          pEVar8 = this->next;
        }
        uVar12 = (ulong)(ushort)*pEVar8;
        if ((0xff < uVar12) || ((ASCIIChars::classes[uVar12] & 0x20) == 0)) goto LAB_00ebd747;
      } while( true );
    }
  }
  else if ((ushort)*pEVar8 < 0x100) goto LAB_00ebd4a4;
  pEVar1 = this->tempLocationOfSurrogatePair;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  if (this->inputLim <= pEVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00ebdb87;
    *puVar7 = 0;
    pEVar8 = this->next;
    uVar12 = (ulong)(ushort)*pEVar8;
  }
  this->next = pEVar8 + 1;
  uVar9 = (uint)uVar12;
  if (uVar9 < 0x100) {
    if ((ASCIIChars::classes[uVar12] & 2) != 0) {
LAB_00ebd562:
      Fail(this,-0x7ff5fc0c);
    }
  }
  else if ((uVar9 & 0xfffe) == 0x2028) goto LAB_00ebd562;
  bVar3 = false;
  if (uVar9 < 0x62) {
    if (uVar9 == 0x44) {
      return false;
    }
    if (uVar9 == 0x53) {
      return false;
    }
    if (uVar9 == 0x57) {
      return false;
    }
switchD_00ebd59a_caseD_65:
    *singleton = (Char)uVar12;
  }
  else {
    switch(uVar9) {
    case 0x62:
      *singleton = L'\b';
      break;
    case 99:
      pEVar8 = this->next;
      if (this->inputLim < pEVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ebdb87;
        *puVar7 = 0;
        pEVar8 = this->next;
      }
      if ((0xff < (ulong)(ushort)*pEVar8) || ((ASCIIChars::classes[(ushort)*pEVar8] & 8) == 0)) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
        pEVar8 = this->next;
      }
      if (this->inputLim < pEVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) {
LAB_00ebdb87:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
        pEVar8 = this->next;
      }
      if (((ulong)(ushort)*pEVar8 < 0x100) && ((ASCIIChars::classes[(ushort)*pEVar8] & 1) != 0)) {
        EVar4 = ECLookahead(this,0);
        CVar5 = Chars<char16_t>::UTC((ushort)EVar4 & 0x1f);
        *singleton = CVar5;
        n = 1;
LAB_00ebda22:
        ECConsume(this,n);
      }
      else {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      break;
    case 100:
    case 0x73:
    case 0x77:
      goto switchD_00ebd59a_caseD_64;
    default:
      goto switchD_00ebd59a_caseD_65;
    case 0x66:
      *singleton = L'\f';
      break;
    case 0x6e:
      *singleton = L'\n';
      break;
    case 0x72:
      *singleton = L'\r';
      break;
    case 0x74:
      *singleton = L'\t';
      break;
    case 0x75:
      this->tempLocationOfSurrogatePair = pEVar1;
      iVar11 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar11) {
        return true;
      }
      if (this->next + 4 <= this->inputLim) {
        EVar4 = ECLookahead(this,0);
        if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
          EVar4 = ECLookahead(this,1);
          if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
            EVar4 = ECLookahead(this,2);
            if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
              EVar4 = ECLookahead(this,3);
              if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
                uVar13 = 0;
                EVar4 = ECLookahead(this,0);
                uVar9 = 0;
                if ((ushort)EVar4 < 0x100) {
                  uVar9 = (uint)(byte)ASCIIChars::values[(ushort)EVar4] << 0xc;
                }
                EVar4 = ECLookahead(this,1);
                if ((ushort)EVar4 < 0x100) {
                  uVar13 = (uint)(byte)ASCIIChars::values[(ushort)EVar4] << 8;
                }
                EVar4 = ECLookahead(this,2);
                uVar10 = 0;
                uVar6 = 0;
                if ((ushort)EVar4 < 0x100) {
                  uVar6 = (uint)(byte)ASCIIChars::values[(ushort)EVar4] << 4;
                }
                EVar4 = ECLookahead(this,3);
                if ((ushort)EVar4 < 0x100) {
                  uVar10 = (uint)(byte)ASCIIChars::values[(ushort)EVar4];
                }
                CVar5 = Chars<char16_t>::UTC(uVar13 | uVar9 | uVar6 | uVar10);
                *singleton = CVar5;
                if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
                  TrackIfSurrogatePair(this,(uint)(ushort)CVar5,this->next + -1,5);
                }
                ECConsume(this,4);
                return true;
              }
            }
          }
        }
      }
      *singleton = L'u';
      return true;
    case 0x76:
      *singleton = L'\v';
      break;
    case 0x78:
      if (this->next + 2 <= this->inputLim) {
        EVar4 = ECLookahead(this,0);
        if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
          EVar4 = ECLookahead(this,1);
          if (((ushort)EVar4 < 0x100) && ((ASCIIChars::classes[(ushort)EVar4] & 0x40) != 0)) {
            uVar13 = 0;
            EVar4 = ECLookahead(this,0);
            uVar9 = 0;
            if ((ushort)EVar4 < 0x100) {
              uVar9 = (uint)(byte)ASCIIChars::values[(ushort)EVar4] << 4;
            }
            EVar4 = ECLookahead(this,1);
            if ((ushort)EVar4 < 0x100) {
              uVar13 = (uint)(byte)ASCIIChars::values[(ushort)EVar4];
            }
            CVar5 = Chars<char16_t>::UTC(uVar13 | uVar9);
            *singleton = CVar5;
            n = 2;
            goto LAB_00ebda22;
          }
        }
      }
      *singleton = L'x';
    }
  }
LAB_00ebd756:
  bVar3 = true;
switchD_00ebd59a_caseD_64:
  return bVar3;
LAB_00ebd747:
  *singleton = (Char)uVar9;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  goto LAB_00ebd756;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }